

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O1

void __thiscall
cli::Parser::Parser(Parser *this,int argc,char **argv,string *generalProgramDescriptionForHelpText)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  allocator<char> local_61;
  Parser *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this,*argv,(allocator<char> *)&local_50);
  local_58 = &(this->_general_help_text).field_2;
  (this->_general_help_text)._M_dataplus._M_p = (pointer)local_58;
  pcVar2 = (generalProgramDescriptionForHelpText->_M_dataplus)._M_p;
  paVar1 = &generalProgramDescriptionForHelpText->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&generalProgramDescriptionForHelpText->field_2 + 8);
    local_58->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_general_help_text).field_2 + 8) = uVar3;
  }
  else {
    (this->_general_help_text)._M_dataplus._M_p = pcVar2;
    (this->_general_help_text).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->_general_help_text)._M_string_length =
       generalProgramDescriptionForHelpText->_M_string_length;
  (generalProgramDescriptionForHelpText->_M_dataplus)._M_p = (pointer)paVar1;
  generalProgramDescriptionForHelpText->_M_string_length = 0;
  (generalProgramDescriptionForHelpText->field_2)._M_local_buf[0] = '\0';
  (this->_commands).
  super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_commands).
  super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_arguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_commands).
  super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_arguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_arguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60 = this;
  if (1 < argc) {
    uVar4 = 1;
    do {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,argv[uVar4],&local_61);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->_arguments,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar4 = uVar4 + 1;
    } while ((uint)argc != uVar4);
  }
  enable_help(local_60);
  return;
}

Assistant:

Parser(int argc, char** argv, std::string generalProgramDescriptionForHelpText) :
				_appname(argv[0]),
				_general_help_text(std::move(generalProgramDescriptionForHelpText)) {
			for (int i = 1; i < argc; ++i) {
				_arguments.push_back(argv[i]);
			}
			enable_help();
		}